

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O2

void update_box(j_decompress_ptr cinfo,boxptr boxp)

{
  J_COLOR_SPACE JVar1;
  _func_void_j_decompress_ptr *p_Var2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  short *psVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  long local_50;
  long local_40;
  
  p_Var2 = cinfo->cquantize[1].finish_pass;
  iVar12 = boxp->c0min;
  iVar13 = boxp->c0max;
  lVar14 = (long)iVar13;
  iVar10 = boxp->c1min;
  lVar11 = (long)iVar10;
  iVar16 = boxp->c1max;
  lVar17 = (long)iVar16;
  iVar3 = boxp->c2min;
  local_40 = (long)iVar3;
  iVar4 = boxp->c2max;
  if (iVar12 < iVar13) {
    for (lVar15 = (long)iVar12; lVar7 = lVar11 << 6, lVar6 = lVar11, lVar15 <= lVar14;
        lVar15 = lVar15 + 1) {
      for (; lVar6 <= lVar17; lVar6 = lVar6 + 1) {
        for (lVar5 = local_40; (int)lVar5 <= iVar4; lVar5 = lVar5 + 1) {
          if (*(short *)(*(long *)(p_Var2 + lVar15 * 8) + lVar7 + lVar5 * 2) != 0) {
            iVar12 = (int)lVar15;
            boxp->c0min = iVar12;
            goto LAB_00124aec;
          }
        }
        lVar7 = lVar7 + 0x40;
      }
    }
  }
LAB_00124aec:
  if (iVar12 < iVar13) {
    for (; lVar15 = lVar11, lVar7 = lVar11 << 6, iVar12 <= lVar14; lVar14 = lVar14 + -1) {
      for (; lVar15 <= lVar17; lVar15 = lVar15 + 1) {
        for (lVar6 = local_40; (int)lVar6 <= iVar4; lVar6 = lVar6 + 1) {
          if (*(short *)(*(long *)(p_Var2 + lVar14 * 8) + lVar7 + lVar6 * 2) != 0) {
            iVar13 = (int)lVar14;
            boxp->c0max = iVar13;
            goto LAB_00124b55;
          }
        }
        lVar7 = lVar7 + 0x40;
      }
    }
  }
LAB_00124b55:
  if (iVar10 < iVar16) {
    lVar14 = lVar11 << 6;
    for (; lVar15 = (long)iVar12, lVar11 <= lVar17; lVar11 = lVar11 + 1) {
      for (; lVar15 <= iVar13; lVar15 = lVar15 + 1) {
        for (lVar7 = local_40; (int)lVar7 <= iVar4; lVar7 = lVar7 + 1) {
          if (*(short *)(*(long *)(p_Var2 + lVar15 * 8) + lVar14 + lVar7 * 2) != 0) {
            iVar10 = (int)lVar11;
            boxp->c1min = iVar10;
            goto LAB_00124bbe;
          }
        }
      }
      lVar14 = lVar14 + 0x40;
    }
  }
LAB_00124bbe:
  if (iVar10 < iVar16) {
    lVar11 = lVar17 << 6;
    for (; lVar14 = (long)iVar12, iVar10 <= lVar17; lVar17 = lVar17 + -1) {
      for (; lVar14 <= iVar13; lVar14 = lVar14 + 1) {
        for (lVar15 = local_40; (int)lVar15 <= iVar4; lVar15 = lVar15 + 1) {
          if (*(short *)(*(long *)(p_Var2 + lVar14 * 8) + lVar11 + lVar15 * 2) != 0) {
            iVar16 = (int)lVar17;
            boxp->c1max = iVar16;
            goto LAB_00124c2f;
          }
        }
      }
      lVar11 = lVar11 + -0x40;
    }
  }
LAB_00124c2f:
  local_50 = (long)iVar4;
  if (iVar3 < iVar4) {
    for (; lVar11 = (long)iVar12, local_40 <= local_50; local_40 = local_40 + 1) {
      for (; lVar11 <= iVar13; lVar11 = lVar11 + 1) {
        psVar9 = (short *)(*(long *)(p_Var2 + lVar11 * 8) + (long)iVar10 * 0x40 + local_40 * 2);
        for (iVar8 = iVar10; iVar8 <= iVar16; iVar8 = iVar8 + 1) {
          if (*psVar9 != 0) {
            iVar3 = (int)local_40;
            boxp->c2min = iVar3;
            goto LAB_00124ca0;
          }
          psVar9 = psVar9 + 0x20;
        }
      }
    }
  }
LAB_00124ca0:
  if (iVar3 < iVar4) {
    for (; lVar11 = (long)iVar12, iVar3 <= local_50; local_50 = local_50 + -1) {
      for (; lVar11 <= iVar13; lVar11 = lVar11 + 1) {
        psVar9 = (short *)(*(long *)(p_Var2 + lVar11 * 8) + (long)iVar10 * 0x40 + local_50 * 2);
        for (iVar8 = iVar10; iVar8 <= iVar16; iVar8 = iVar8 + 1) {
          if (*psVar9 != 0) {
            iVar4 = (int)local_50;
            boxp->c2max = iVar4;
            goto LAB_00124d40;
          }
          psVar9 = psVar9 + 0x20;
        }
      }
    }
  }
LAB_00124d40:
  JVar1 = cinfo->out_color_space;
  lVar17 = (long)((iVar13 - iVar12) * 8) * (long)c_scales[rgb_red[JVar1]];
  lVar11 = (long)((iVar16 - iVar10) * 4) * (long)c_scales[rgb_green[JVar1]];
  lVar14 = (long)((iVar4 - iVar3) * 8) * (long)c_scales[rgb_blue[JVar1]];
  boxp->volume = lVar14 * lVar14 + lVar11 * lVar11 + lVar17 * lVar17;
  lVar14 = 0;
  for (lVar11 = (long)iVar12; lVar17 = (long)iVar10, lVar11 <= iVar13; lVar11 = lVar11 + 1) {
    for (; lVar17 <= iVar16; lVar17 = lVar17 + 1) {
      psVar9 = (short *)(lVar17 * 0x40 + *(long *)(p_Var2 + lVar11 * 8) + (long)iVar3 * 2);
      for (iVar12 = iVar3; iVar12 <= iVar4; iVar12 = iVar12 + 1) {
        lVar14 = (lVar14 + 1) - (ulong)(*psVar9 == 0);
        psVar9 = psVar9 + 1;
      }
    }
  }
  boxp->colorcount = lVar14;
  return;
}

Assistant:

LOCAL(void)
update_box(j_decompress_ptr cinfo, boxptr boxp)
/* Shrink the min/max bounds of a box to enclose only nonzero elements, */
/* and recompute its volume and population */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  hist3d histogram = cquantize->histogram;
  histptr histp;
  int c0, c1, c2;
  int c0min, c0max, c1min, c1max, c2min, c2max;
  JLONG dist0, dist1, dist2;
  long ccount;

  c0min = boxp->c0min;  c0max = boxp->c0max;
  c1min = boxp->c1min;  c1max = boxp->c1max;
  c2min = boxp->c2min;  c2max = boxp->c2max;

  if (c0max > c0min)
    for (c0 = c0min; c0 <= c0max; c0++)
      for (c1 = c1min; c1 <= c1max; c1++) {
        histp = &histogram[c0][c1][c2min];
        for (c2 = c2min; c2 <= c2max; c2++)
          if (*histp++ != 0) {
            boxp->c0min = c0min = c0;
            goto have_c0min;
          }
      }
have_c0min:
  if (c0max > c0min)
    for (c0 = c0max; c0 >= c0min; c0--)
      for (c1 = c1min; c1 <= c1max; c1++) {
        histp = &histogram[c0][c1][c2min];
        for (c2 = c2min; c2 <= c2max; c2++)
          if (*histp++ != 0) {
            boxp->c0max = c0max = c0;
            goto have_c0max;
          }
      }
have_c0max:
  if (c1max > c1min)
    for (c1 = c1min; c1 <= c1max; c1++)
      for (c0 = c0min; c0 <= c0max; c0++) {
        histp = &histogram[c0][c1][c2min];
        for (c2 = c2min; c2 <= c2max; c2++)
          if (*histp++ != 0) {
            boxp->c1min = c1min = c1;
            goto have_c1min;
          }
      }
have_c1min:
  if (c1max > c1min)
    for (c1 = c1max; c1 >= c1min; c1--)
      for (c0 = c0min; c0 <= c0max; c0++) {
        histp = &histogram[c0][c1][c2min];
        for (c2 = c2min; c2 <= c2max; c2++)
          if (*histp++ != 0) {
            boxp->c1max = c1max = c1;
            goto have_c1max;
          }
      }
have_c1max:
  if (c2max > c2min)
    for (c2 = c2min; c2 <= c2max; c2++)
      for (c0 = c0min; c0 <= c0max; c0++) {
        histp = &histogram[c0][c1min][c2];
        for (c1 = c1min; c1 <= c1max; c1++, histp += HIST_C2_ELEMS)
          if (*histp != 0) {
            boxp->c2min = c2min = c2;
            goto have_c2min;
          }
      }
have_c2min:
  if (c2max > c2min)
    for (c2 = c2max; c2 >= c2min; c2--)
      for (c0 = c0min; c0 <= c0max; c0++) {
        histp = &histogram[c0][c1min][c2];
        for (c1 = c1min; c1 <= c1max; c1++, histp += HIST_C2_ELEMS)
          if (*histp != 0) {
            boxp->c2max = c2max = c2;
            goto have_c2max;
          }
      }
have_c2max:

  /* Update box volume.
   * We use 2-norm rather than real volume here; this biases the method
   * against making long narrow boxes, and it has the side benefit that
   * a box is splittable iff norm > 0.
   * Since the differences are expressed in histogram-cell units,
   * we have to shift back to JSAMPLE units to get consistent distances;
   * after which, we scale according to the selected distance scale factors.
   */
  dist0 = ((c0max - c0min) << C0_SHIFT) * C0_SCALE;
  dist1 = ((c1max - c1min) << C1_SHIFT) * C1_SCALE;
  dist2 = ((c2max - c2min) << C2_SHIFT) * C2_SCALE;
  boxp->volume = dist0 * dist0 + dist1 * dist1 + dist2 * dist2;

  /* Now scan remaining volume of box and compute population */
  ccount = 0;
  for (c0 = c0min; c0 <= c0max; c0++)
    for (c1 = c1min; c1 <= c1max; c1++) {
      histp = &histogram[c0][c1][c2min];
      for (c2 = c2min; c2 <= c2max; c2++, histp++)
        if (*histp != 0) {
          ccount++;
        }
    }
  boxp->colorcount = ccount;
}